

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

Ptr __thiscall hwnet::TCPSocket::SetUserData(TCPSocket *this,any *ud_)

{
  any *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  any *ud__local;
  TCPSocket *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)&ud_[0x93].counter);
  any::operator=((any *)&ud_[0xa6].counter,in_RDX);
  std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
            ((enable_shared_from_this<hwnet::TCPSocket> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr SetUserData(any ud_) {
		std::lock_guard<std::mutex> guard(this->mtx);
		this->ud = ud_;	
		return shared_from_this();	
	}